

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O0

void MOJOSHADER_freeCompileData(MOJOSHADER_compileData *_data)

{
  void *pvVar1;
  MOJOSHADER_free local_38;
  int local_2c;
  int i;
  void *d;
  MOJOSHADER_free f;
  MOJOSHADER_compileData *data;
  MOJOSHADER_compileData *_data_local;
  
  if ((_data != (MOJOSHADER_compileData *)0x0) && (_data != &MOJOSHADER_out_of_mem_compile_data)) {
    if (_data->free == (MOJOSHADER_free)0x0) {
      local_38 = MOJOSHADER_internal_free;
    }
    else {
      local_38 = _data->free;
    }
    pvVar1 = _data->malloc_data;
    for (local_2c = 0; local_2c < _data->error_count; local_2c = local_2c + 1) {
      (*local_38)(_data->errors[local_2c].error,pvVar1);
      (*local_38)(_data->errors[local_2c].filename,pvVar1);
    }
    (*local_38)(_data->errors,pvVar1);
    for (local_2c = 0; local_2c < _data->warning_count; local_2c = local_2c + 1) {
      (*local_38)(_data->warnings[local_2c].error,pvVar1);
      (*local_38)(_data->warnings[local_2c].filename,pvVar1);
    }
    (*local_38)(_data->warnings,pvVar1);
    for (local_2c = 0; local_2c < _data->symbol_count; local_2c = local_2c + 1) {
      (*local_38)(_data->symbols[local_2c].name,pvVar1);
    }
    (*local_38)(_data->symbols,pvVar1);
    (*local_38)(_data->output,pvVar1);
    (*local_38)(_data,pvVar1);
  }
  return;
}

Assistant:

void MOJOSHADER_freeCompileData(const MOJOSHADER_compileData *_data)
{
    MOJOSHADER_compileData *data = (MOJOSHADER_compileData *) _data;
    if ((data == NULL) || (data == &MOJOSHADER_out_of_mem_compile_data))
        return;  // no-op.

    MOJOSHADER_free f = (data->free == NULL) ? MOJOSHADER_internal_free : data->free;
    void *d = data->malloc_data;
    int i;

    // we don't f(data->source_profile), because that's internal static data.

    for (i = 0; i < data->error_count; i++)
    {
        f((void *) data->errors[i].error, d);
        f((void *) data->errors[i].filename, d);
    } // for
    f((void *) data->errors, d);

    for (i = 0; i < data->warning_count; i++)
    {
        f((void *) data->warnings[i].error, d);
        f((void *) data->warnings[i].filename, d);
    } // for
    f((void *) data->warnings, d);

    for (i = 0; i < data->symbol_count; i++)
    {
        f((void *) data->symbols[i].name, d);
        // !!! FIXME: this is missing stuff (including freeing substructs).
    } // for
    f((void *) data->symbols, d);

    f((void *) data->output, d);
    f(data, d);
}